

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereAddLimit(WhereClause *pWC,Select *p)

{
  int iCsr;
  SrcList *pSVar1;
  ExprList *pEVar2;
  char *pcVar3;
  long lVar4;
  
  if ((((p->pGroupBy == (ExprList *)0x0) && ((p->selFlags & 9) == 0)) &&
      (pSVar1 = p->pSrc, pSVar1->nSrc == 1)) && ((pSVar1->a[0].pTab)->eTabType == '\x01')) {
    pEVar2 = p->pOrderBy;
    iCsr = pSVar1->a[0].iCursor;
    if (0 < (long)pWC->nTerm) {
      lVar4 = 0;
      do {
        if (((*(byte *)((long)&pWC->a->wtFlags + lVar4) & 4) == 0) &&
           (*(int *)((long)&pWC->a->leftCursor + lVar4) != iCsr)) {
          return;
        }
        lVar4 = lVar4 + 0x38;
      } while ((long)pWC->nTerm * 0x38 - lVar4 != 0);
    }
    if ((pEVar2 != (ExprList *)0x0) && (0 < (long)pEVar2->nExpr)) {
      lVar4 = 0;
      do {
        pcVar3 = *(char **)((long)&pEVar2->a[0].pExpr + lVar4);
        if (*pcVar3 != -0x59) {
          return;
        }
        if (*(int *)(pcVar3 + 0x2c) != iCsr) {
          return;
        }
        if (((&pEVar2->a[0].fg.sortFlags)[lVar4] & 2) != 0) {
          return;
        }
        lVar4 = lVar4 + 0x18;
      } while ((long)pEVar2->nExpr * 0x18 != lVar4);
    }
    whereAddLimitExpr(pWC,p->iLimit,p->pLimit->pLeft,iCsr,0x49);
    if (0 < p->iOffset) {
      whereAddLimitExpr(pWC,p->iOffset,p->pLimit->pRight,iCsr,0x4a);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3WhereAddLimit(WhereClause *pWC, Select *p){
  assert( p!=0 && p->pLimit!=0 );                 /* 1 -- checked by caller */
  if( p->pGroupBy==0
   && (p->selFlags & (SF_Distinct|SF_Aggregate))==0             /* 2 */
   && (p->pSrc->nSrc==1 && IsVirtual(p->pSrc->a[0].pTab))       /* 3 */
  ){
    ExprList *pOrderBy = p->pOrderBy;
    int iCsr = p->pSrc->a[0].iCursor;
    int ii;

    /* Check condition (4). Return early if it is not met. */
    for(ii=0; ii<pWC->nTerm; ii++){
      if( pWC->a[ii].wtFlags & TERM_CODED ){
        /* This term is a vector operation that has been decomposed into
        ** other, subsequent terms.  It can be ignored. See tag-20220128a */
        assert( pWC->a[ii].wtFlags & TERM_VIRTUAL );
        assert( pWC->a[ii].eOperator==WO_ROWVAL );
        continue;
      }
      if( pWC->a[ii].leftCursor!=iCsr ) return;
    }

    /* Check condition (5). Return early if it is not met. */
    if( pOrderBy ){
      for(ii=0; ii<pOrderBy->nExpr; ii++){
        Expr *pExpr = pOrderBy->a[ii].pExpr;
        if( pExpr->op!=TK_COLUMN ) return;
        if( pExpr->iTable!=iCsr ) return;
        if( pOrderBy->a[ii].fg.sortFlags & KEYINFO_ORDER_BIGNULL ) return;
      }
    }

    /* All conditions are met. Add the terms to the where-clause object. */
    assert( p->pLimit->op==TK_LIMIT );
    whereAddLimitExpr(pWC, p->iLimit, p->pLimit->pLeft,
                      iCsr, SQLITE_INDEX_CONSTRAINT_LIMIT);
    if( p->iOffset>0 ){
      whereAddLimitExpr(pWC, p->iOffset, p->pLimit->pRight,
                        iCsr, SQLITE_INDEX_CONSTRAINT_OFFSET);
    }
  }
}